

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O3

void aom_hadamard_8x8_sse2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  short *psVar4;
  short *psVar5;
  short *psVar6;
  short *psVar7;
  short sVar8;
  short sVar14;
  undefined4 uVar9;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar13 [16];
  short sVar21;
  short sVar27;
  undefined4 uVar22;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar45;
  undefined4 uVar35;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  undefined1 auVar40 [16];
  short sVar52;
  short sVar58;
  undefined4 uVar53;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar71;
  undefined4 uVar66;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar88;
  undefined4 uVar79;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  undefined1 auVar83 [16];
  short sVar95;
  short sVar107;
  undefined4 uVar96;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  undefined1 auVar101 [16];
  short sVar114;
  short sVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  short sVar127;
  short sVar128;
  short sVar129;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  short sVar130;
  short sVar150;
  short sVar151;
  short sVar152;
  short sVar153;
  short sVar154;
  short sVar155;
  short sVar156;
  short sVar157;
  undefined1 auVar131 [16];
  undefined1 auVar137 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  short sVar164;
  short sVar165;
  undefined1 auVar158 [16];
  short sVar166;
  short sVar167;
  short sVar173;
  short sVar174;
  undefined4 uVar168;
  short sVar175;
  short sVar176;
  short sVar177;
  short sVar178;
  short sVar179;
  short sVar180;
  short sVar181;
  short sVar182;
  short sVar183;
  short sVar184;
  short sVar185;
  short sVar186;
  short sVar187;
  short sVar188;
  short sVar189;
  short sVar190;
  short sVar191;
  undefined6 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [12];
  undefined6 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [12];
  undefined1 auVar26 [16];
  undefined1 auVar41 [16];
  undefined6 uVar36;
  undefined1 auVar42 [16];
  undefined8 uVar37;
  undefined1 auVar38 [12];
  undefined1 auVar43 [16];
  undefined1 auVar39 [16];
  undefined1 auVar44 [16];
  undefined6 uVar54;
  undefined8 uVar55;
  undefined1 auVar56 [12];
  undefined1 auVar57 [16];
  undefined6 uVar67;
  undefined8 uVar68;
  undefined1 auVar69 [12];
  undefined1 auVar70 [16];
  undefined1 auVar84 [16];
  undefined6 uVar80;
  undefined1 auVar85 [16];
  undefined8 uVar81;
  undefined1 auVar82 [12];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar102 [16];
  undefined6 uVar97;
  undefined1 auVar103 [16];
  undefined8 uVar98;
  undefined1 auVar104 [16];
  undefined1 auVar99 [12];
  undefined1 auVar105 [16];
  undefined1 auVar100 [16];
  undefined1 auVar106 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar132 [16];
  undefined1 auVar138 [16];
  undefined1 auVar145 [16];
  undefined1 auVar133 [16];
  undefined1 auVar139 [16];
  undefined1 auVar146 [16];
  undefined1 auVar134 [16];
  undefined1 auVar140 [16];
  undefined1 auVar147 [16];
  undefined1 auVar135 [16];
  undefined1 auVar141 [16];
  undefined1 auVar148 [16];
  undefined1 auVar136 [16];
  undefined1 auVar142 [16];
  undefined1 auVar149 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined6 uVar169;
  undefined8 uVar170;
  undefined1 auVar171 [12];
  undefined1 auVar172 [16];
  
  psVar1 = src_diff + src_stride;
  psVar2 = psVar1 + src_stride;
  psVar3 = psVar2 + src_stride;
  psVar4 = psVar3 + src_stride;
  psVar5 = psVar4 + src_stride;
  psVar6 = psVar5 + src_stride;
  psVar7 = psVar6 + src_stride;
  sVar78 = *psVar1 + *src_diff;
  sVar88 = psVar1[1] + src_diff[1];
  sVar89 = psVar1[2] + src_diff[2];
  sVar90 = psVar1[3] + src_diff[3];
  sVar91 = psVar1[4] + src_diff[4];
  sVar92 = psVar1[5] + src_diff[5];
  sVar93 = psVar1[6] + src_diff[6];
  sVar94 = psVar1[7] + src_diff[7];
  sVar8 = *src_diff - *psVar1;
  sVar14 = src_diff[1] - psVar1[1];
  sVar15 = src_diff[2] - psVar1[2];
  sVar16 = src_diff[3] - psVar1[3];
  sVar17 = src_diff[4] - psVar1[4];
  sVar18 = src_diff[5] - psVar1[5];
  sVar19 = src_diff[6] - psVar1[6];
  sVar20 = src_diff[7] - psVar1[7];
  sVar166 = *psVar3 + *psVar2;
  sVar173 = psVar3[1] + psVar2[1];
  sVar175 = psVar3[2] + psVar2[2];
  sVar177 = psVar3[3] + psVar2[3];
  sVar179 = psVar3[4] + psVar2[4];
  sVar181 = psVar3[5] + psVar2[5];
  sVar183 = psVar3[6] + psVar2[6];
  sVar185 = psVar3[7] + psVar2[7];
  sVar21 = *psVar2 - *psVar3;
  sVar27 = psVar2[1] - psVar3[1];
  sVar28 = psVar2[2] - psVar3[2];
  sVar29 = psVar2[3] - psVar3[3];
  sVar30 = psVar2[4] - psVar3[4];
  sVar31 = psVar2[5] - psVar3[5];
  sVar32 = psVar2[6] - psVar3[6];
  sVar33 = psVar2[7] - psVar3[7];
  sVar114 = *psVar5 + *psVar4;
  sVar123 = psVar5[1] + psVar4[1];
  sVar124 = psVar5[2] + psVar4[2];
  sVar125 = psVar5[3] + psVar4[3];
  sVar126 = psVar5[4] + psVar4[4];
  sVar127 = psVar5[5] + psVar4[5];
  sVar128 = psVar5[6] + psVar4[6];
  sVar129 = psVar5[7] + psVar4[7];
  sVar95 = *psVar4 - *psVar5;
  sVar107 = psVar4[1] - psVar5[1];
  sVar108 = psVar4[2] - psVar5[2];
  sVar109 = psVar4[3] - psVar5[3];
  sVar110 = psVar4[4] - psVar5[4];
  sVar111 = psVar4[5] - psVar5[5];
  sVar112 = psVar4[6] - psVar5[6];
  sVar113 = psVar4[7] - psVar5[7];
  sVar130 = *psVar7 + *psVar6;
  sVar150 = psVar7[1] + psVar6[1];
  sVar151 = psVar7[2] + psVar6[2];
  sVar152 = psVar7[3] + psVar6[3];
  sVar153 = psVar7[4] + psVar6[4];
  sVar154 = psVar7[5] + psVar6[5];
  sVar155 = psVar7[6] + psVar6[6];
  sVar156 = psVar7[7] + psVar6[7];
  sVar65 = *psVar6 - *psVar7;
  sVar71 = psVar6[1] - psVar7[1];
  sVar72 = psVar6[2] - psVar7[2];
  sVar73 = psVar6[3] - psVar7[3];
  sVar74 = psVar6[4] - psVar7[4];
  sVar75 = psVar6[5] - psVar7[5];
  sVar76 = psVar6[6] - psVar7[6];
  sVar77 = psVar6[7] - psVar7[7];
  sVar34 = sVar166 + sVar78;
  sVar45 = sVar173 + sVar88;
  sVar46 = sVar175 + sVar89;
  sVar47 = sVar177 + sVar90;
  sVar48 = sVar179 + sVar91;
  sVar49 = sVar181 + sVar92;
  sVar50 = sVar183 + sVar93;
  sVar51 = sVar185 + sVar94;
  sVar52 = sVar21 + sVar8;
  sVar58 = sVar27 + sVar14;
  sVar59 = sVar28 + sVar15;
  sVar60 = sVar29 + sVar16;
  sVar61 = sVar30 + sVar17;
  sVar62 = sVar31 + sVar18;
  sVar63 = sVar32 + sVar19;
  sVar64 = sVar33 + sVar20;
  sVar78 = sVar78 - sVar166;
  sVar88 = sVar88 - sVar173;
  sVar89 = sVar89 - sVar175;
  sVar90 = sVar90 - sVar177;
  sVar91 = sVar91 - sVar179;
  sVar92 = sVar92 - sVar181;
  sVar93 = sVar93 - sVar183;
  sVar94 = sVar94 - sVar185;
  sVar8 = sVar8 - sVar21;
  sVar14 = sVar14 - sVar27;
  sVar15 = sVar15 - sVar28;
  sVar16 = sVar16 - sVar29;
  sVar17 = sVar17 - sVar30;
  sVar18 = sVar18 - sVar31;
  sVar19 = sVar19 - sVar32;
  sVar20 = sVar20 - sVar33;
  sVar166 = sVar130 + sVar114;
  sVar173 = sVar150 + sVar123;
  sVar175 = sVar151 + sVar124;
  sVar177 = sVar152 + sVar125;
  sVar179 = sVar153 + sVar126;
  sVar183 = sVar154 + sVar127;
  sVar164 = sVar155 + sVar128;
  sVar165 = sVar156 + sVar129;
  sVar167 = sVar65 + sVar95;
  sVar174 = sVar71 + sVar107;
  sVar176 = sVar72 + sVar108;
  sVar178 = sVar73 + sVar109;
  sVar180 = sVar74 + sVar110;
  sVar182 = sVar75 + sVar111;
  sVar184 = sVar76 + sVar112;
  sVar186 = sVar77 + sVar113;
  sVar114 = sVar114 - sVar130;
  sVar123 = sVar123 - sVar150;
  sVar124 = sVar124 - sVar151;
  sVar125 = sVar125 - sVar152;
  sVar126 = sVar126 - sVar153;
  sVar127 = sVar127 - sVar154;
  sVar128 = sVar128 - sVar155;
  sVar129 = sVar129 - sVar156;
  sVar95 = sVar95 - sVar65;
  sVar107 = sVar107 - sVar71;
  sVar108 = sVar108 - sVar72;
  sVar109 = sVar109 - sVar73;
  sVar110 = sVar110 - sVar74;
  sVar111 = sVar111 - sVar75;
  sVar112 = sVar112 - sVar76;
  sVar113 = sVar113 - sVar77;
  sVar21 = sVar166 + sVar34;
  sVar30 = sVar173 + sVar45;
  sVar31 = sVar175 + sVar46;
  sVar32 = sVar177 + sVar47;
  sVar33 = sVar179 + sVar48;
  sVar65 = sVar183 + sVar49;
  sVar71 = sVar164 + sVar50;
  sVar72 = sVar165 + sVar51;
  sVar29 = sVar167 + sVar52;
  sVar77 = sVar174 + sVar58;
  sVar75 = sVar176 + sVar59;
  sVar154 = sVar178 + sVar60;
  sVar156 = sVar180 + sVar61;
  sVar181 = sVar182 + sVar62;
  sVar185 = sVar184 + sVar63;
  sVar157 = sVar186 + sVar64;
  sVar27 = sVar114 + sVar78;
  sVar187 = sVar123 + sVar88;
  sVar73 = sVar124 + sVar89;
  sVar188 = sVar125 + sVar90;
  sVar155 = sVar126 + sVar91;
  sVar189 = sVar127 + sVar92;
  sVar190 = sVar128 + sVar93;
  sVar191 = sVar129 + sVar94;
  sVar28 = sVar95 + sVar8;
  sVar76 = sVar107 + sVar14;
  sVar74 = sVar108 + sVar15;
  sVar130 = sVar109 + sVar16;
  sVar150 = sVar110 + sVar17;
  sVar151 = sVar111 + sVar18;
  sVar152 = sVar112 + sVar19;
  sVar153 = sVar113 + sVar20;
  sVar34 = sVar34 - sVar166;
  sVar45 = sVar45 - sVar173;
  sVar46 = sVar46 - sVar175;
  sVar47 = sVar47 - sVar177;
  sVar48 = sVar48 - sVar179;
  sVar49 = sVar49 - sVar183;
  sVar50 = sVar50 - sVar164;
  sVar51 = sVar51 - sVar165;
  sVar52 = sVar52 - sVar167;
  sVar58 = sVar58 - sVar174;
  sVar59 = sVar59 - sVar176;
  sVar60 = sVar60 - sVar178;
  sVar61 = sVar61 - sVar180;
  sVar62 = sVar62 - sVar182;
  sVar63 = sVar63 - sVar184;
  sVar64 = sVar64 - sVar186;
  sVar78 = sVar78 - sVar114;
  sVar88 = sVar88 - sVar123;
  sVar89 = sVar89 - sVar124;
  sVar90 = sVar90 - sVar125;
  sVar91 = sVar91 - sVar126;
  sVar92 = sVar92 - sVar127;
  sVar93 = sVar93 - sVar128;
  sVar94 = sVar94 - sVar129;
  sVar8 = sVar8 - sVar95;
  sVar14 = sVar14 - sVar107;
  sVar15 = sVar15 - sVar108;
  sVar16 = sVar16 - sVar109;
  sVar17 = sVar17 - sVar110;
  sVar18 = sVar18 - sVar111;
  sVar19 = sVar19 - sVar112;
  sVar20 = sVar20 - sVar113;
  sVar111 = sVar30 + sVar21;
  sVar112 = sVar88 + sVar78;
  sVar113 = sVar45 + sVar34;
  sVar114 = sVar187 + sVar27;
  sVar123 = sVar76 + sVar28;
  sVar124 = sVar14 + sVar8;
  sVar125 = sVar58 + sVar52;
  sVar126 = sVar77 + sVar29;
  sVar21 = sVar21 - sVar30;
  sVar78 = sVar78 - sVar88;
  sVar34 = sVar34 - sVar45;
  sVar27 = sVar27 - sVar187;
  sVar28 = sVar28 - sVar76;
  sVar8 = sVar8 - sVar14;
  sVar52 = sVar52 - sVar58;
  sVar29 = sVar29 - sVar77;
  sVar76 = sVar32 + sVar31;
  sVar77 = sVar90 + sVar89;
  sVar88 = sVar47 + sVar46;
  sVar95 = sVar188 + sVar73;
  sVar107 = sVar130 + sVar74;
  sVar108 = sVar16 + sVar15;
  sVar109 = sVar60 + sVar59;
  sVar110 = sVar154 + sVar75;
  sVar31 = sVar31 - sVar32;
  sVar89 = sVar89 - sVar90;
  sVar46 = sVar46 - sVar47;
  sVar73 = sVar73 - sVar188;
  sVar74 = sVar74 - sVar130;
  sVar15 = sVar15 - sVar16;
  sVar59 = sVar59 - sVar60;
  sVar75 = sVar75 - sVar154;
  sVar166 = sVar65 + sVar33;
  sVar173 = sVar92 + sVar91;
  sVar175 = sVar49 + sVar48;
  sVar177 = sVar189 + sVar155;
  sVar179 = sVar151 + sVar150;
  sVar183 = sVar18 + sVar17;
  sVar164 = sVar62 + sVar61;
  sVar165 = sVar181 + sVar156;
  sVar33 = sVar33 - sVar65;
  sVar91 = sVar91 - sVar92;
  sVar48 = sVar48 - sVar49;
  sVar155 = sVar155 - sVar189;
  sVar150 = sVar150 - sVar151;
  sVar17 = sVar17 - sVar18;
  sVar61 = sVar61 - sVar62;
  sVar156 = sVar156 - sVar181;
  sVar130 = sVar72 + sVar71;
  sVar151 = sVar94 + sVar93;
  sVar90 = sVar51 + sVar50;
  sVar92 = sVar191 + sVar190;
  sVar127 = sVar153 + sVar152;
  sVar128 = sVar20 + sVar19;
  sVar129 = sVar64 + sVar63;
  sVar154 = sVar157 + sVar185;
  sVar71 = sVar71 - sVar72;
  sVar93 = sVar93 - sVar94;
  sVar50 = sVar50 - sVar51;
  sVar190 = sVar190 - sVar191;
  sVar152 = sVar152 - sVar153;
  sVar19 = sVar19 - sVar20;
  sVar63 = sVar63 - sVar64;
  sVar185 = sVar185 - sVar157;
  sVar14 = sVar76 + sVar111;
  sVar16 = sVar77 + sVar112;
  sVar18 = sVar88 + sVar113;
  sVar20 = sVar95 + sVar114;
  sVar30 = sVar107 + sVar123;
  sVar32 = sVar108 + sVar124;
  sVar65 = sVar109 + sVar125;
  sVar72 = sVar110 + sVar126;
  sVar45 = sVar31 + sVar21;
  sVar47 = sVar89 + sVar78;
  sVar49 = sVar46 + sVar34;
  sVar51 = sVar73 + sVar27;
  sVar58 = sVar74 + sVar28;
  sVar60 = sVar15 + sVar8;
  sVar62 = sVar59 + sVar52;
  sVar64 = sVar75 + sVar29;
  sVar111 = sVar111 - sVar76;
  sVar112 = sVar112 - sVar77;
  sVar113 = sVar113 - sVar88;
  sVar114 = sVar114 - sVar95;
  sVar123 = sVar123 - sVar107;
  sVar124 = sVar124 - sVar108;
  sVar125 = sVar125 - sVar109;
  sVar126 = sVar126 - sVar110;
  sVar21 = sVar21 - sVar31;
  sVar78 = sVar78 - sVar89;
  sVar34 = sVar34 - sVar46;
  sVar27 = sVar27 - sVar73;
  sVar28 = sVar28 - sVar74;
  sVar8 = sVar8 - sVar15;
  sVar52 = sVar52 - sVar59;
  sVar29 = sVar29 - sVar75;
  sVar95 = sVar130 + sVar166;
  sVar107 = sVar151 + sVar173;
  sVar108 = sVar90 + sVar175;
  sVar109 = sVar92 + sVar177;
  sVar153 = sVar127 + sVar179;
  sVar110 = sVar128 + sVar183;
  sVar94 = sVar129 + sVar164;
  sVar181 = sVar154 + sVar165;
  sVar157 = sVar71 + sVar33;
  sVar167 = sVar93 + sVar91;
  sVar174 = sVar50 + sVar48;
  sVar176 = sVar190 + sVar155;
  sVar178 = sVar152 + sVar150;
  sVar180 = sVar19 + sVar17;
  sVar182 = sVar63 + sVar61;
  sVar184 = sVar185 + sVar156;
  sVar166 = sVar166 - sVar130;
  sVar173 = sVar173 - sVar151;
  sVar175 = sVar175 - sVar90;
  sVar177 = sVar177 - sVar92;
  sVar179 = sVar179 - sVar127;
  sVar183 = sVar183 - sVar128;
  sVar164 = sVar164 - sVar129;
  sVar165 = sVar165 - sVar154;
  sVar33 = sVar33 - sVar71;
  sVar91 = sVar91 - sVar93;
  sVar48 = sVar48 - sVar50;
  sVar155 = sVar155 - sVar190;
  sVar150 = sVar150 - sVar152;
  sVar17 = sVar17 - sVar19;
  sVar61 = sVar61 - sVar63;
  sVar156 = sVar156 - sVar185;
  sVar130 = sVar95 + sVar14;
  sVar151 = sVar107 + sVar16;
  uVar168 = CONCAT22(sVar151,sVar130);
  sVar152 = sVar108 + sVar18;
  uVar169 = CONCAT24(sVar152,uVar168);
  sVar90 = sVar109 + sVar20;
  uVar170 = CONCAT26(sVar90,uVar169);
  sVar92 = sVar153 + sVar30;
  auVar171._0_10_ = CONCAT28(sVar92,uVar170);
  auVar171._10_2_ = sVar110 + sVar32;
  auVar172._12_2_ = sVar94 + sVar65;
  auVar172._0_12_ = auVar171;
  auVar172._14_2_ = sVar181 + sVar72;
  sVar50 = sVar157 + sVar45;
  sVar89 = sVar167 + sVar47;
  uVar66 = CONCAT22(sVar89,sVar50);
  sVar59 = sVar174 + sVar49;
  uVar67 = CONCAT24(sVar59,uVar66);
  sVar73 = sVar176 + sVar51;
  uVar68 = CONCAT26(sVar73,uVar67);
  sVar74 = sVar178 + sVar58;
  auVar69._0_10_ = CONCAT28(sVar74,uVar68);
  auVar69._10_2_ = sVar180 + sVar60;
  auVar70._12_2_ = sVar182 + sVar62;
  auVar70._0_12_ = auVar69;
  auVar70._14_2_ = sVar184 + sVar64;
  sVar15 = sVar166 + sVar111;
  sVar19 = sVar173 + sVar112;
  uVar53 = CONCAT22(sVar19,sVar15);
  sVar31 = sVar175 + sVar113;
  uVar54 = CONCAT24(sVar31,uVar53);
  sVar71 = sVar177 + sVar114;
  uVar55 = CONCAT26(sVar71,uVar54);
  sVar46 = sVar179 + sVar123;
  auVar56._0_10_ = CONCAT28(sVar46,uVar55);
  auVar56._10_2_ = sVar183 + sVar124;
  auVar57._12_2_ = sVar164 + sVar125;
  auVar57._0_12_ = auVar56;
  auVar57._14_2_ = sVar165 + sVar126;
  sVar63 = sVar33 + sVar21;
  sVar75 = sVar91 + sVar78;
  uVar96 = CONCAT22(sVar75,sVar63);
  sVar76 = sVar48 + sVar34;
  uVar97 = CONCAT24(sVar76,uVar96);
  sVar77 = sVar155 + sVar27;
  uVar98 = CONCAT26(sVar77,uVar97);
  sVar88 = sVar150 + sVar28;
  auVar99._0_10_ = CONCAT28(sVar88,uVar98);
  auVar99._10_2_ = sVar17 + sVar8;
  auVar100._12_2_ = sVar61 + sVar52;
  auVar100._0_12_ = auVar99;
  auVar100._14_2_ = sVar156 + sVar29;
  sVar14 = sVar14 - sVar95;
  sVar16 = sVar16 - sVar107;
  uVar22 = CONCAT22(sVar16,sVar14);
  sVar18 = sVar18 - sVar108;
  uVar23 = CONCAT24(sVar18,uVar22);
  sVar20 = sVar20 - sVar109;
  uVar24 = CONCAT26(sVar20,uVar23);
  sVar30 = sVar30 - sVar153;
  auVar25._0_10_ = CONCAT28(sVar30,uVar24);
  auVar25._10_2_ = sVar32 - sVar110;
  auVar26._12_2_ = sVar65 - sVar94;
  auVar26._0_12_ = auVar25;
  auVar26._14_2_ = sVar72 - sVar181;
  sVar45 = sVar45 - sVar157;
  sVar47 = sVar47 - sVar167;
  uVar35 = CONCAT22(sVar47,sVar45);
  sVar49 = sVar49 - sVar174;
  uVar36 = CONCAT24(sVar49,uVar35);
  sVar51 = sVar51 - sVar176;
  uVar37 = CONCAT26(sVar51,uVar36);
  sVar58 = sVar58 - sVar178;
  auVar38._0_10_ = CONCAT28(sVar58,uVar37);
  auVar38._10_2_ = sVar60 - sVar180;
  auVar39._12_2_ = sVar62 - sVar182;
  auVar39._0_12_ = auVar38;
  auVar39._14_2_ = sVar64 - sVar184;
  sVar111 = sVar111 - sVar166;
  sVar112 = sVar112 - sVar173;
  uVar79 = CONCAT22(sVar112,sVar111);
  sVar113 = sVar113 - sVar175;
  uVar80 = CONCAT24(sVar113,uVar79);
  sVar114 = sVar114 - sVar177;
  uVar81 = CONCAT26(sVar114,uVar80);
  sVar123 = sVar123 - sVar179;
  auVar82._0_10_ = CONCAT28(sVar123,uVar81);
  auVar82._10_2_ = sVar124 - sVar183;
  auVar116._12_2_ = sVar125 - sVar164;
  auVar116._0_12_ = auVar82;
  auVar116._14_2_ = sVar126 - sVar165;
  sVar21 = sVar21 - sVar33;
  sVar78 = sVar78 - sVar91;
  uVar9 = CONCAT22(sVar78,sVar21);
  sVar34 = sVar34 - sVar48;
  uVar10 = CONCAT24(sVar34,uVar9);
  sVar27 = sVar27 - sVar155;
  uVar11 = CONCAT26(sVar27,uVar10);
  sVar28 = sVar28 - sVar150;
  auVar12._0_10_ = CONCAT28(sVar28,uVar11);
  auVar12._10_2_ = sVar8 - sVar17;
  auVar13._12_2_ = sVar52 - sVar61;
  auVar13._0_12_ = auVar12;
  auVar13._14_2_ = sVar29 - sVar156;
  auVar115 = psraw(auVar172,0xf);
  auVar136._12_2_ = sVar90;
  auVar136._0_12_ = auVar171;
  auVar136._14_2_ = auVar115._6_2_;
  auVar135._12_4_ = auVar136._12_4_;
  auVar135._10_2_ = auVar115._4_2_;
  auVar135._0_10_ = auVar171._0_10_;
  auVar134._10_6_ = auVar135._10_6_;
  auVar134._8_2_ = sVar152;
  auVar134._0_8_ = uVar170;
  auVar133._8_8_ = auVar134._8_8_;
  auVar133._6_2_ = auVar115._2_2_;
  auVar133._0_6_ = uVar169;
  auVar132._6_10_ = auVar133._6_10_;
  auVar132._4_2_ = sVar151;
  auVar132._0_4_ = uVar168;
  auVar131._4_12_ = auVar132._4_12_;
  auVar131._2_2_ = auVar115._0_2_;
  auVar131._0_2_ = sVar130;
  *(undefined1 (*) [16])coeff = auVar131;
  *(short *)(coeff + 4) = sVar92;
  *(short *)((long)coeff + 0x12) = auVar115._8_2_;
  *(short *)(coeff + 5) = auVar171._10_2_;
  *(short *)((long)coeff + 0x16) = auVar115._10_2_;
  *(short *)(coeff + 6) = auVar172._12_2_;
  *(short *)((long)coeff + 0x1a) = auVar115._12_2_;
  *(short *)(coeff + 7) = auVar172._14_2_;
  *(short *)((long)coeff + 0x1e) = auVar115._14_2_;
  auVar115 = psraw(auVar116,0xf);
  auVar142._12_2_ = sVar114;
  auVar142._0_12_ = auVar82;
  auVar142._14_2_ = auVar115._6_2_;
  auVar141._12_4_ = auVar142._12_4_;
  auVar141._10_2_ = auVar115._4_2_;
  auVar141._0_10_ = auVar82._0_10_;
  auVar140._10_6_ = auVar141._10_6_;
  auVar140._8_2_ = sVar113;
  auVar140._0_8_ = uVar81;
  auVar139._8_8_ = auVar140._8_8_;
  auVar139._6_2_ = auVar115._2_2_;
  auVar139._0_6_ = uVar80;
  auVar138._6_10_ = auVar139._6_10_;
  auVar138._4_2_ = sVar112;
  auVar138._0_4_ = uVar79;
  auVar137._4_12_ = auVar138._4_12_;
  auVar137._2_2_ = auVar115._0_2_;
  auVar137._0_2_ = sVar111;
  *(undefined1 (*) [16])(coeff + 8) = auVar137;
  *(short *)(coeff + 0xc) = sVar123;
  *(short *)((long)coeff + 0x32) = auVar115._8_2_;
  *(short *)(coeff + 0xd) = auVar82._10_2_;
  *(short *)((long)coeff + 0x36) = auVar115._10_2_;
  *(short *)(coeff + 0xe) = auVar116._12_2_;
  *(short *)((long)coeff + 0x3a) = auVar115._12_2_;
  *(short *)(coeff + 0xf) = auVar116._14_2_;
  *(short *)((long)coeff + 0x3e) = auVar115._14_2_;
  auVar116 = psraw(auVar26,0xf);
  auVar87._12_2_ = sVar20;
  auVar87._0_12_ = auVar25;
  auVar87._14_2_ = auVar116._6_2_;
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._10_2_ = auVar116._4_2_;
  auVar86._0_10_ = auVar25._0_10_;
  auVar143._10_6_ = auVar86._10_6_;
  auVar143._8_2_ = sVar18;
  auVar143._0_8_ = uVar24;
  auVar85._8_8_ = auVar143._8_8_;
  auVar85._6_2_ = auVar116._2_2_;
  auVar85._0_6_ = uVar23;
  auVar84._6_10_ = auVar85._6_10_;
  auVar84._4_2_ = sVar16;
  auVar84._0_4_ = uVar22;
  auVar83._4_12_ = auVar84._4_12_;
  auVar83._2_2_ = auVar116._0_2_;
  auVar83._0_2_ = sVar14;
  auVar143 = psraw(auVar57,0xf);
  auVar122._12_2_ = sVar71;
  auVar122._0_12_ = auVar56;
  auVar122._14_2_ = auVar143._6_2_;
  auVar121._12_4_ = auVar122._12_4_;
  auVar121._10_2_ = auVar143._4_2_;
  auVar121._0_10_ = auVar56._0_10_;
  auVar120._10_6_ = auVar121._10_6_;
  auVar120._8_2_ = sVar31;
  auVar120._0_8_ = uVar55;
  auVar119._8_8_ = auVar120._8_8_;
  auVar119._6_2_ = auVar143._2_2_;
  auVar119._0_6_ = uVar54;
  auVar118._6_10_ = auVar119._6_10_;
  auVar118._4_2_ = sVar19;
  auVar118._0_4_ = uVar53;
  auVar117._4_12_ = auVar118._4_12_;
  auVar117._2_2_ = auVar143._0_2_;
  auVar117._0_2_ = sVar15;
  auVar115 = psraw(auVar100,0xf);
  auVar163._12_2_ = sVar77;
  auVar163._0_12_ = auVar99;
  auVar163._14_2_ = auVar115._6_2_;
  auVar162._12_4_ = auVar163._12_4_;
  auVar162._10_2_ = auVar115._4_2_;
  auVar162._0_10_ = auVar99._0_10_;
  auVar161._10_6_ = auVar162._10_6_;
  auVar161._8_2_ = sVar76;
  auVar161._0_8_ = uVar98;
  auVar160._8_8_ = auVar161._8_8_;
  auVar160._6_2_ = auVar115._2_2_;
  auVar160._0_6_ = uVar97;
  auVar159._6_10_ = auVar160._6_10_;
  auVar159._4_2_ = sVar75;
  auVar159._0_4_ = uVar96;
  auVar158._4_12_ = auVar159._4_12_;
  auVar158._2_2_ = auVar115._0_2_;
  auVar158._0_2_ = sVar63;
  *(undefined1 (*) [16])(coeff + 0x20) = auVar158;
  *(short *)(coeff + 0x24) = sVar88;
  *(short *)((long)coeff + 0x92) = auVar115._8_2_;
  *(short *)(coeff + 0x25) = auVar99._10_2_;
  *(short *)((long)coeff + 0x96) = auVar115._10_2_;
  *(short *)(coeff + 0x26) = auVar100._12_2_;
  *(short *)((long)coeff + 0x9a) = auVar115._12_2_;
  *(short *)(coeff + 0x27) = auVar100._14_2_;
  *(short *)((long)coeff + 0x9e) = auVar115._14_2_;
  auVar115 = psraw(auVar13,0xf);
  auVar149._12_2_ = sVar27;
  auVar149._0_12_ = auVar12;
  auVar149._14_2_ = auVar115._6_2_;
  auVar148._12_4_ = auVar149._12_4_;
  auVar148._10_2_ = auVar115._4_2_;
  auVar148._0_10_ = auVar12._0_10_;
  auVar147._10_6_ = auVar148._10_6_;
  auVar147._8_2_ = sVar34;
  auVar147._0_8_ = uVar11;
  auVar146._8_8_ = auVar147._8_8_;
  auVar146._6_2_ = auVar115._2_2_;
  auVar146._0_6_ = uVar10;
  auVar145._6_10_ = auVar146._6_10_;
  auVar145._4_2_ = sVar78;
  auVar145._0_4_ = uVar9;
  auVar144._4_12_ = auVar145._4_12_;
  auVar144._2_2_ = auVar115._0_2_;
  auVar144._0_2_ = sVar21;
  *(undefined1 (*) [16])(coeff + 0x28) = auVar144;
  *(short *)(coeff + 0x2c) = sVar28;
  *(short *)((long)coeff + 0xb2) = auVar115._8_2_;
  *(short *)(coeff + 0x2d) = auVar12._10_2_;
  *(short *)((long)coeff + 0xb6) = auVar115._10_2_;
  *(short *)(coeff + 0x2e) = auVar13._12_2_;
  *(short *)((long)coeff + 0xba) = auVar115._12_2_;
  *(short *)(coeff + 0x2f) = auVar13._14_2_;
  *(short *)((long)coeff + 0xbe) = auVar115._14_2_;
  auVar13 = psraw(auVar39,0xf);
  auVar106._12_2_ = sVar51;
  auVar106._0_12_ = auVar38;
  auVar106._14_2_ = auVar13._6_2_;
  auVar105._12_4_ = auVar106._12_4_;
  auVar105._10_2_ = auVar13._4_2_;
  auVar105._0_10_ = auVar38._0_10_;
  auVar104._10_6_ = auVar105._10_6_;
  auVar104._8_2_ = sVar49;
  auVar104._0_8_ = uVar37;
  auVar103._8_8_ = auVar104._8_8_;
  auVar103._6_2_ = auVar13._2_2_;
  auVar103._0_6_ = uVar36;
  auVar102._6_10_ = auVar103._6_10_;
  auVar102._4_2_ = sVar47;
  auVar102._0_4_ = uVar35;
  auVar101._4_12_ = auVar102._4_12_;
  auVar101._2_2_ = auVar13._0_2_;
  auVar101._0_2_ = sVar45;
  *(undefined1 (*) [16])(coeff + 0x30) = auVar101;
  *(short *)(coeff + 0x34) = sVar58;
  *(short *)((long)coeff + 0xd2) = auVar13._8_2_;
  *(short *)(coeff + 0x35) = auVar38._10_2_;
  *(short *)((long)coeff + 0xd6) = auVar13._10_2_;
  *(short *)(coeff + 0x36) = auVar39._12_2_;
  *(short *)((long)coeff + 0xda) = auVar13._12_2_;
  *(short *)(coeff + 0x37) = auVar39._14_2_;
  *(short *)((long)coeff + 0xde) = auVar13._14_2_;
  auVar13 = psraw(auVar70,0xf);
  auVar44._12_2_ = sVar73;
  auVar44._0_12_ = auVar69;
  auVar44._14_2_ = auVar13._6_2_;
  auVar43._12_4_ = auVar44._12_4_;
  auVar43._10_2_ = auVar13._4_2_;
  auVar43._0_10_ = auVar69._0_10_;
  auVar115._10_6_ = auVar43._10_6_;
  auVar115._8_2_ = sVar59;
  auVar115._0_8_ = uVar68;
  auVar42._8_8_ = auVar115._8_8_;
  auVar42._6_2_ = auVar13._2_2_;
  auVar42._0_6_ = uVar67;
  auVar41._6_10_ = auVar42._6_10_;
  auVar41._4_2_ = sVar89;
  auVar41._0_4_ = uVar66;
  auVar40._4_12_ = auVar41._4_12_;
  auVar40._2_2_ = auVar13._0_2_;
  auVar40._0_2_ = sVar50;
  *(undefined1 (*) [16])(coeff + 0x38) = auVar40;
  *(short *)(coeff + 0x3c) = sVar74;
  *(short *)((long)coeff + 0xf2) = auVar13._8_2_;
  *(short *)(coeff + 0x3d) = auVar69._10_2_;
  *(short *)((long)coeff + 0xf6) = auVar13._10_2_;
  *(short *)(coeff + 0x3e) = auVar70._12_2_;
  *(short *)((long)coeff + 0xfa) = auVar13._12_2_;
  *(short *)(coeff + 0x3f) = auVar70._14_2_;
  *(short *)((long)coeff + 0xfe) = auVar13._14_2_;
  *(undefined1 (*) [16])(coeff + 0x10) = auVar83;
  *(short *)(coeff + 0x14) = sVar30;
  *(short *)((long)coeff + 0x52) = auVar116._8_2_;
  *(short *)(coeff + 0x15) = auVar25._10_2_;
  *(short *)((long)coeff + 0x56) = auVar116._10_2_;
  *(short *)(coeff + 0x16) = auVar26._12_2_;
  *(short *)((long)coeff + 0x5a) = auVar116._12_2_;
  *(short *)(coeff + 0x17) = auVar26._14_2_;
  *(short *)((long)coeff + 0x5e) = auVar116._14_2_;
  *(undefined1 (*) [16])(coeff + 0x18) = auVar117;
  *(short *)(coeff + 0x1c) = sVar46;
  *(short *)((long)coeff + 0x72) = auVar143._8_2_;
  *(short *)(coeff + 0x1d) = auVar56._10_2_;
  *(short *)((long)coeff + 0x76) = auVar143._10_2_;
  *(short *)(coeff + 0x1e) = auVar57._12_2_;
  *(short *)((long)coeff + 0x7a) = auVar143._12_2_;
  *(short *)(coeff + 0x1f) = auVar57._14_2_;
  *(short *)((long)coeff + 0x7e) = auVar143._14_2_;
  return;
}

Assistant:

static inline void hadamard_8x8_sse2(const int16_t *src_diff,
                                     ptrdiff_t src_stride, tran_low_t *coeff,
                                     int is_final) {
  __m128i src[8];
  src[0] = _mm_load_si128((const __m128i *)src_diff);
  src[1] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[2] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[3] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[4] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[5] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[6] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[7] = _mm_load_si128((const __m128i *)(src_diff + src_stride));

  hadamard_col8_sse2(src, 0);
  hadamard_col8_sse2(src, 1);

  if (is_final) {
    store_tran_low(src[0], coeff);
    coeff += 8;
    store_tran_low(src[1], coeff);
    coeff += 8;
    store_tran_low(src[2], coeff);
    coeff += 8;
    store_tran_low(src[3], coeff);
    coeff += 8;
    store_tran_low(src[4], coeff);
    coeff += 8;
    store_tran_low(src[5], coeff);
    coeff += 8;
    store_tran_low(src[6], coeff);
    coeff += 8;
    store_tran_low(src[7], coeff);
  } else {
    int16_t *coeff16 = (int16_t *)coeff;
    _mm_store_si128((__m128i *)coeff16, src[0]);
    coeff16 += 8;
    _mm_store_si128((__m128i *)coeff16, src[1]);
    coeff16 += 8;
    _mm_store_si128((__m128i *)coeff16, src[2]);
    coeff16 += 8;
    _mm_store_si128((__m128i *)coeff16, src[3]);
    coeff16 += 8;
    _mm_store_si128((__m128i *)coeff16, src[4]);
    coeff16 += 8;
    _mm_store_si128((__m128i *)coeff16, src[5]);
    coeff16 += 8;
    _mm_store_si128((__m128i *)coeff16, src[6]);
    coeff16 += 8;
    _mm_store_si128((__m128i *)coeff16, src[7]);
  }
}